

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v8::detail::write<char,fmt::v8::appender>
                   (appender out,char *s,basic_format_specs<char> *specs,locale_ref param_4)

{
  presentation_type pVar1;
  appender aVar2;
  size_t sVar3;
  basic_string_view<char> s_00;
  error_handler local_19;
  
  pVar1 = specs->type;
  if ((1 < pVar1 - 0x10) && (pVar1 != none)) {
    error_handler::on_error(&local_19,"invalid type specifier");
  }
  if ((pVar1 & ~string) != none) {
    aVar2 = write_ptr<char,fmt::v8::appender,unsigned_long>(out,(unsigned_long)s,specs);
    return (appender)aVar2.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  }
  sVar3 = strlen(s);
  s_00.size_ = sVar3;
  s_00.data_ = s;
  aVar2 = write<char,fmt::v8::appender>(out,s_00,specs,(locale_ref)0x0);
  return (appender)aVar2.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, const Char* s,
                         const basic_format_specs<Char>& specs, locale_ref)
    -> OutputIt {
  return check_cstring_type_spec(specs.type)
             ? write(out, basic_string_view<Char>(s), specs, {})
             : write_ptr<Char>(out, to_uintptr(s), &specs);
}